

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ARMDisassembler.c
# Opt level: O3

_Bool Thumb_getInstruction
                (csh ud,uint8_t *code,size_t code_len,MCInst *instr,uint16_t *size,uint64_t address,
                void *info)

{
  uint8_t *puVar1;
  ushort uVar2;
  cs_detail *pcVar3;
  DecodeStatus DVar4;
  uint uVar5;
  long lVar6;
  MCOperand *pMVar7;
  int64_t iVar8;
  int64_t iVar9;
  ushort insn;
  MCRegisterInfo *MRI;
  int iVar10;
  uint32_t insn_00;
  
  iVar10 = (int)address;
  if (code_len < 2) {
    return false;
  }
  pcVar3 = instr->flat_insn->detail;
  MRI = (MCRegisterInfo *)size;
  if (pcVar3 != (cs_detail *)0x0) {
    memset(&pcVar3->field_6,0,0x5c8);
    lVar6 = 0x58;
    do {
      puVar1 = instr->flat_insn->detail->regs_read + lVar6;
      puVar1[0] = 0xff;
      puVar1[1] = 0xff;
      puVar1[2] = 0xff;
      puVar1[3] = 0xff;
      lVar6 = lVar6 + 0x28;
    } while (lVar6 != 0x5f8);
  }
  uVar2 = *(ushort *)code;
  insn = uVar2 << 8 | uVar2 >> 8;
  if (*(char *)(ud + 0x28) == '\0') {
    insn = uVar2;
  }
  DVar4 = decodeInstruction_2(DecoderTableThumb16,instr,insn,(ulong)*(uint *)(ud + 4),MRI,iVar10);
  if (DVar4 == MCDisassembler_Fail) {
    MCInst_clear(instr);
    DVar4 = decodeInstruction_2(DecoderTableThumbSBit16,instr,insn,(ulong)*(uint *)(ud + 4),MRI,
                                iVar10);
    if (DVar4 == MCDisassembler_Fail) {
      MCInst_clear(instr);
      DVar4 = decodeInstruction_2(DecoderTableThumb216,instr,insn,(ulong)*(uint *)(ud + 4),MRI,
                                  iVar10);
      if (DVar4 != MCDisassembler_Fail) {
        *size = 2;
        uVar5 = MCInst_getOpcode(instr);
        if ((uVar5 == 0x923) && (*(int *)(ud + 100) != 0)) {
          return true;
        }
        AddThumbPredicate((cs_struct *)ud,instr);
        uVar5 = MCInst_getOpcode(instr);
        if (uVar5 == 0x923) {
          pMVar7 = MCInst_getOperand(instr,0);
          iVar8 = MCOperand_getImm(pMVar7);
          pMVar7 = MCInst_getOperand(instr,1);
          iVar9 = MCOperand_getImm(pMVar7);
          ITStatus_setITState((ARM_ITStatus *)(ud + 0x5c),(char)iVar8,(char)iVar9);
          return true;
        }
        return true;
      }
      if (code_len < 4) {
        return false;
      }
      uVar5 = *(uint *)code;
      if (*(char *)(ud + 0x28) != '\x01') {
        uVar5 = (uint)*code << 0x10 | (uint)code[1] << 0x18 | (uint)code[3] << 8 | (uint)code[2];
      }
      MCInst_clear(instr);
      DVar4 = decodeInstruction_4(DecoderTableThumb32,instr,uVar5,(ulong)*(uint *)(ud + 4),MRI,
                                  iVar10);
      if (DVar4 == MCDisassembler_Fail) {
        MCInst_clear(instr);
        DVar4 = decodeInstruction_4(DecoderTableThumb232,instr,uVar5,(ulong)*(uint *)(ud + 4),MRI,
                                    iVar10);
        if (DVar4 == MCDisassembler_Fail) {
          MCInst_clear(instr);
          DVar4 = decodeInstruction_4(DecoderTableVFP32,instr,uVar5,(ulong)*(uint *)(ud + 4),MRI,
                                      iVar10);
          if (DVar4 != MCDisassembler_Fail) {
LAB_00147dc0:
            *size = 4;
            UpdateThumbVFPPredicate((cs_struct *)ud,instr);
            return true;
          }
          if ((uVar5 & 0xf0000000) == 0xe0000000) {
            MCInst_clear(instr);
            DVar4 = decodeInstruction_4(DecoderTableVFP32,instr,uVar5,(ulong)*(uint *)(ud + 4),MRI,
                                        iVar10);
            if (DVar4 != MCDisassembler_Fail) goto LAB_00147dc0;
          }
          MCInst_clear(instr);
          DVar4 = decodeInstruction_4(DecoderTableVFPV832,instr,uVar5,(ulong)*(uint *)(ud + 4),MRI,
                                      iVar10);
          if (DVar4 != MCDisassembler_Fail) goto LAB_00147e2b;
          if ((uVar5 & 0xf0000000) == 0xe0000000) {
            MCInst_clear(instr);
            DVar4 = decodeInstruction_4(DecoderTableNEONDup32,instr,uVar5,(ulong)*(uint *)(ud + 4),
                                        MRI,iVar10);
            if (DVar4 != MCDisassembler_Fail) goto LAB_00147d94;
          }
          if ((uVar5 & 0xff000000) == 0xf9000000) {
            MCInst_clear(instr);
            DVar4 = decodeInstruction_4(DecoderTableNEONLoadStore32,instr,
                                        uVar5 & 0xf0ffffff | 0x4000000,(ulong)*(uint *)(ud + 4),MRI,
                                        iVar10);
            if (DVar4 != MCDisassembler_Fail) goto LAB_00147d94;
          }
          if ((~uVar5 & 0xf000000) == 0) {
            MCInst_clear(instr);
            insn_00 = (uVar5 & 0xe0ffffff) + (uVar5 >> 4 & 0x1000000) + 0x12000000;
            DVar4 = decodeInstruction_4(DecoderTableNEONData32,instr,insn_00,
                                        (ulong)*(uint *)(ud + 4),MRI,iVar10);
            if (DVar4 != MCDisassembler_Fail) goto LAB_00147d94;
          }
          else {
            insn_00 = (uVar5 & 0xe0ffffff) + (uVar5 >> 4 & 0x1000000) + 0x12000000;
          }
          MCInst_clear(instr);
          DVar4 = decodeInstruction_4(DecoderTablev8Crypto32,instr,insn_00,(ulong)*(uint *)(ud + 4),
                                      MRI,iVar10);
          if (DVar4 == MCDisassembler_Fail) {
            MCInst_clear(instr);
            DVar4 = decodeInstruction_4(DecoderTablev8NEON32,instr,uVar5 & 0xf3ffffff,
                                        (ulong)*(uint *)(ud + 4),MRI,iVar10);
            if (DVar4 == MCDisassembler_Fail) {
              MCInst_clear(instr);
              *size = 0;
              return false;
            }
          }
LAB_00147e2b:
          *size = 4;
          return true;
        }
LAB_00147d94:
        *size = 4;
        goto LAB_00147bf6;
      }
      *size = 4;
    }
    else {
      *size = 2;
    }
    iVar10 = *(int *)(ud + 100);
    AddThumbPredicate((cs_struct *)ud,instr);
    AddThumb1SBit(instr,iVar10 != 0);
  }
  else {
    *size = 2;
LAB_00147bf6:
    AddThumbPredicate((cs_struct *)ud,instr);
  }
  return true;
}

Assistant:

static DecodeStatus _Thumb_getInstruction(cs_struct *ud, MCInst *MI, const uint8_t *code, size_t code_len,
		uint16_t *Size, uint64_t Address)
{
	uint8_t bytes[4];
	uint16_t insn16;
	DecodeStatus result;
	bool InITBlock;
	unsigned Firstcond, Mask; 
	uint32_t NEONLdStInsn, insn32, NEONDataInsn, NEONCryptoInsn, NEONv8Insn;
	size_t i;

	// We want to read exactly 2 bytes of data.
	if (code_len < 2)
		// not enough data
		return MCDisassembler_Fail;

	if (MI->flat_insn->detail) {
		memset(&MI->flat_insn->detail->arm, 0, sizeof(cs_arm));
		for (i = 0; i < ARR_SIZE(MI->flat_insn->detail->arm.operands); i++)
			MI->flat_insn->detail->arm.operands[i].vector_index = -1;
	}

	memcpy(bytes, code, 2);

	if (ud->big_endian)
		insn16 = (bytes[0] << 8) | bytes[1];
	else
		insn16 = (bytes[1] << 8) | bytes[0];

	result = decodeInstruction_2(DecoderTableThumb16, MI, insn16, Address, NULL, ud->mode);
	if (result != MCDisassembler_Fail) {
		*Size = 2;
		Check(&result, AddThumbPredicate(ud, MI));
		return result;
	}

	MCInst_clear(MI);
	result = decodeInstruction_2(DecoderTableThumbSBit16, MI, insn16, Address, NULL, ud->mode);
	if (result) {
		*Size = 2;
		InITBlock = ITStatus_instrInITBlock(&(ud->ITBlock));
		Check(&result, AddThumbPredicate(ud, MI));
		AddThumb1SBit(MI, InITBlock);
		return result;
	}

	MCInst_clear(MI);
	result = decodeInstruction_2(DecoderTableThumb216, MI, insn16, Address, NULL, ud->mode);
	if (result != MCDisassembler_Fail) {
		*Size = 2;

		// Nested IT blocks are UNPREDICTABLE.  Must be checked before we add
		// the Thumb predicate.
		if (MCInst_getOpcode(MI) == ARM_t2IT && ITStatus_instrInITBlock(&(ud->ITBlock)))
			return MCDisassembler_SoftFail;
		Check(&result, AddThumbPredicate(ud, MI));

		// If we find an IT instruction, we need to parse its condition
		// code and mask operands so that we can apply them correctly
		// to the subsequent instructions.
		if (MCInst_getOpcode(MI) == ARM_t2IT) {

			Firstcond = (unsigned int)MCOperand_getImm(MCInst_getOperand(MI, 0));
			Mask = (unsigned int)MCOperand_getImm(MCInst_getOperand(MI, 1));
			ITStatus_setITState(&(ud->ITBlock), (char)Firstcond, (char)Mask);
		}

		return result;
	}

	// We want to read exactly 4 bytes of data.
	if (code_len < 4)
		// not enough data
		return MCDisassembler_Fail;

	memcpy(bytes, code, 4);

	if (ud->big_endian)
		insn32 = (bytes[3] <<  24) |
			(bytes[2] <<  16) |
			(bytes[1] << 8) |
			(bytes[0] << 0);
	else
		insn32 = (bytes[3] <<  8) |
			(bytes[2] <<  0) |
			(bytes[1] << 24) |
			(bytes[0] << 16);

	MCInst_clear(MI);
	result = decodeInstruction_4(DecoderTableThumb32, MI, insn32, Address, NULL, ud->mode);
	if (result != MCDisassembler_Fail) {
		*Size = 4;
		InITBlock = ITStatus_instrInITBlock(&(ud->ITBlock));
		Check(&result, AddThumbPredicate(ud, MI));
		AddThumb1SBit(MI, InITBlock);
		return result;
	}

	MCInst_clear(MI);
	result = decodeInstruction_4(DecoderTableThumb232, MI, insn32, Address, NULL, ud->mode);
	if (result != MCDisassembler_Fail) {
		*Size = 4;
		Check(&result, AddThumbPredicate(ud, MI));
		return result;
	}

	MCInst_clear(MI);
	result = decodeInstruction_4(DecoderTableVFP32, MI, insn32, Address, NULL, ud->mode);
	if (result != MCDisassembler_Fail) {
		*Size = 4;
		UpdateThumbVFPPredicate(ud, MI);
		return result;
	}

	if (fieldFromInstruction_4(insn32, 28, 4) == 0xE) {
		MCInst_clear(MI);
		result = decodeInstruction_4(DecoderTableVFP32, MI, insn32, Address, NULL, ud->mode);
		if (result != MCDisassembler_Fail) {
			*Size = 4;
			UpdateThumbVFPPredicate(ud, MI);
			return result;
		}
	}

	MCInst_clear(MI);
	result = decodeInstruction_4(DecoderTableVFPV832, MI, insn32, Address, NULL, ud->mode);
	if (result != MCDisassembler_Fail) {
		*Size = 4;
		return result;
	}

	if (fieldFromInstruction_4(insn32, 28, 4) == 0xE) {
		MCInst_clear(MI);
		result = decodeInstruction_4(DecoderTableNEONDup32, MI, insn32, Address, NULL, ud->mode);
		if (result != MCDisassembler_Fail) {
			*Size = 4;
			Check(&result, AddThumbPredicate(ud, MI));
			return result;
		}
	}

	if (fieldFromInstruction_4(insn32, 24, 8) == 0xF9) {
		MCInst_clear(MI);
		NEONLdStInsn = insn32;
		NEONLdStInsn &= 0xF0FFFFFF;
		NEONLdStInsn |= 0x04000000;
		result = decodeInstruction_4(DecoderTableNEONLoadStore32, MI, NEONLdStInsn, Address, NULL, ud->mode);
		if (result != MCDisassembler_Fail) {
			*Size = 4;
			Check(&result, AddThumbPredicate(ud, MI));
			return result;
		}
	}

	if (fieldFromInstruction_4(insn32, 24, 4) == 0xF) {
		MCInst_clear(MI);
		NEONDataInsn = insn32;
		NEONDataInsn &= 0xF0FFFFFF; // Clear bits 27-24
		NEONDataInsn |= (NEONDataInsn & 0x10000000) >> 4; // Move bit 28 to bit 24
		NEONDataInsn |= 0x12000000; // Set bits 28 and 25
		result = decodeInstruction_4(DecoderTableNEONData32, MI, NEONDataInsn, Address, NULL, ud->mode);
		if (result != MCDisassembler_Fail) {
			*Size = 4;
			Check(&result, AddThumbPredicate(ud, MI));
			return result;
		}
	}

	MCInst_clear(MI);
	NEONCryptoInsn = insn32;
	NEONCryptoInsn &= 0xF0FFFFFF; // Clear bits 27-24
	NEONCryptoInsn |= (NEONCryptoInsn & 0x10000000) >> 4; // Move bit 28 to bit 24
	NEONCryptoInsn |= 0x12000000; // Set bits 28 and 25
	result = decodeInstruction_4(DecoderTablev8Crypto32, MI, NEONCryptoInsn,
			Address, NULL, ud->mode);
	if (result != MCDisassembler_Fail) {
		*Size = 4;
		return result;
	}

	MCInst_clear(MI);
	NEONv8Insn = insn32;
	NEONv8Insn &= 0xF3FFFFFF; // Clear bits 27-26
	result = decodeInstruction_4(DecoderTablev8NEON32, MI, NEONv8Insn, Address, NULL, ud->mode);
	if (result != MCDisassembler_Fail) {
		*Size = 4;
		return result;
	}

	MCInst_clear(MI);
	*Size = 0;
	return MCDisassembler_Fail;
}